

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
fixRightImbalance(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *this,BSTNode **t)

{
  BSTNode *pBVar1;
  BSTNode *pBVar2;
  BSTNode **ppBVar3;
  int iVar4;
  BSTNode *child_1;
  BSTNode *pBVar5;
  
  pBVar1 = *t;
  pBVar5 = pBVar1->right;
  ppBVar3 = &pBVar5->left;
  pBVar2 = pBVar5->left;
  if (pBVar5->bf == 0) {
    pBVar1->right = pBVar2;
    pBVar5->left = *t;
    *t = pBVar5;
    pBVar5->bf = -1;
LAB_00105a9a:
    iVar4 = 1;
    goto LAB_00105ac2;
  }
  if (pBVar5->bf == -1) {
    iVar4 = pBVar2->bf;
    *ppBVar3 = pBVar2->right;
    pBVar2->right = pBVar1->right;
    pBVar1->right = pBVar2;
    pBVar1 = (*t)->right;
    (*t)->right = pBVar1->left;
    pBVar1->left = *t;
    *t = pBVar1;
    pBVar1->bf = 0;
    if (iVar4 != 1) {
      if (iVar4 != 0) {
        if (iVar4 != -1) {
          return;
        }
        pBVar1->left->bf = 0;
        ppBVar3 = &pBVar1->right;
        goto LAB_00105a9a;
      }
      pBVar5 = pBVar1->right;
      ppBVar3 = &pBVar1->left;
      goto LAB_00105ab9;
    }
    pBVar1->left->bf = -1;
    ppBVar3 = &pBVar1->right;
  }
  else {
    pBVar1->right = pBVar2;
    pBVar5->left = *t;
    *t = pBVar5;
LAB_00105ab9:
    pBVar5->bf = 0;
  }
  iVar4 = 0;
LAB_00105ac2:
  (*ppBVar3)->bf = iVar4;
  return;
}

Assistant:

void fixRightImbalance(BSTNode * & t) {
      BSTNode *child = t->right;
      if (child->bf == BST_LEFT_HEAVY) {
         int oldBF = child->left->bf;
         rotateRight(t->right);
         rotateLeft(t);
         t->bf = BST_IN_BALANCE;
         switch (oldBF) {
          case BST_LEFT_HEAVY:
            t->left->bf = BST_IN_BALANCE;
            t->right->bf = BST_RIGHT_HEAVY;
            break;
          case BST_IN_BALANCE:
            t->left->bf = t->right->bf = BST_IN_BALANCE;
            break;
          case BST_RIGHT_HEAVY:
            t->left->bf = BST_LEFT_HEAVY;
            t->right->bf = BST_IN_BALANCE;
            break;
         }
      } else if (child->bf == BST_IN_BALANCE) {
         rotateLeft(t);
         t->bf = BST_LEFT_HEAVY;
         t->left->bf = BST_RIGHT_HEAVY;
      } else {
         rotateLeft(t);
         t->left->bf = t->bf = BST_IN_BALANCE;
      }
   }